

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

bool crnd::crnd_create_segmented_file
               (void *pData,uint32 data_size,void *pBase_data,uint base_data_size)

{
  crn_packed_uint<4U> *this;
  ushort uVar1;
  uint16 uVar2;
  uint32 val;
  uint uVar3;
  crn_header *pcVar4;
  
  if ((((0x3d < data_size && pData != (void *)0x0) &&
       (pcVar4 = crnd_get_header(pData,data_size), pcVar4 != (crn_header *)0x0)) &&
      (((pcVar4->m_flags).m_buf[1] & 1) == 0)) &&
     (val = crnd_get_segmented_file_size(pData,data_size), val <= base_data_size)) {
    memcpy(pBase_data,pData,(ulong)val);
    crn_packed_uint<2U>::operator=
              ((crn_packed_uint<2U> *)((long)pBase_data + 0x13),
               (ushort)(*(ushort *)((long)pBase_data + 0x13) << 8 |
                       *(ushort *)((long)pBase_data + 0x13) >> 8) | 1);
    this = (crn_packed_uint<4U> *)((long)pBase_data + 6);
    crn_packed_uint<4U>::operator=(this,val);
    uVar1 = *(ushort *)((long)pBase_data + 2);
    uVar3 = crn_packed_uint::operator_cast_to_unsigned_int(this);
    uVar2 = crc16((void *)((ulong)(ushort)(uVar1 << 8 | uVar1 >> 8) + (long)pBase_data),
                  uVar3 - (ushort)(*(ushort *)((long)pBase_data + 2) << 8 |
                                  *(ushort *)((long)pBase_data + 2) >> 8),0);
    crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)pBase_data + 10),(uint)uVar2);
    uVar2 = crc16(this,(ushort)(*(ushort *)((long)pBase_data + 2) << 8 |
                               *(ushort *)((long)pBase_data + 2) >> 8) - 6,0);
    crn_packed_uint<2U>::operator=((crn_packed_uint<2U> *)((long)pBase_data + 4),(uint)uVar2);
    return true;
  }
  return false;
}

Assistant:

bool crnd_create_segmented_file(const void* pData, uint32 data_size, void* pBase_data, uint base_data_size) {
  if ((!pData) || (data_size < cCRNHeaderMinSize))
    return false;

  const crn_header* pHeader = crnd_get_header(pData, data_size);
  if (!pHeader)
    return false;

  if (pHeader->m_flags & cCRNHeaderFlagSegmented)
    return false;

  const uint actual_base_data_size = crnd_get_segmented_file_size(pData, data_size);
  if (base_data_size < actual_base_data_size)
    return false;

  memcpy(pBase_data, pData, actual_base_data_size);

  crn_header& new_header = *static_cast<crn_header*>(pBase_data);
  new_header.m_flags = new_header.m_flags | cCRNHeaderFlagSegmented;
  new_header.m_data_size = actual_base_data_size;

  new_header.m_data_crc16 = crc16((const uint8*)pBase_data + new_header.m_header_size, new_header.m_data_size - new_header.m_header_size);

  new_header.m_header_crc16 = crc16(&new_header.m_data_size, new_header.m_header_size - (uint32)((const uint8*)&new_header.m_data_size - (const uint8*)&new_header));

  CRND_ASSERT(crnd_validate_file(&new_header, actual_base_data_size, NULL));

  return true;
}